

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void i4_factorial_values(int *n_data,int *n,int *fn)

{
  if (*n_data < 0) {
    *n_data = 0;
  }
  if ((long)*n_data < 0xd) {
    *n = cheby_t_poly_values::n_vec[*n_data];
    *fn = *(int *)(&DAT_00228660 + (long)*n_data * 4);
    *n_data = *n_data + 1;
  }
  else {
    *n_data = 0;
    *n = 0;
    *fn = 0;
  }
  return;
}

Assistant:

void i4_factorial_values ( int *n_data, int *n, int *fn )

//****************************************************************************80
//
//  Purpose:
//
//    I4_FACTORIAL_VALUES returns values of the factorial function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to the index of the test data.  On each subsequent call, N_DATA is
//    incremented and that test data is returned.  When there is no more
//    test data, N_DATA is set to 0.
//
//    Output, int *N, the argument of the function.
//
//    Output, int *FN, the value of the function.
//
{
# define N_MAX 13

  int fnvec[N_MAX] = {
    1, 1, 2, 6, 
    24, 120, 720, 5040, 
    40320, 362880, 3628800, 39916800, 
    479001600 };
  int nvec[N_MAX] = {
     0,  1,  2,  3, 
     4,  5,  6,  7, 
     8,  9, 10, 11, 
    12 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *fn = 0;
  }
  else
  {
    *n = nvec[*n_data];
    *fn = fnvec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}